

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<chaiscript::AST_Node>_(const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&),_chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<chaiscript::AST_Node>,_const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&>_>
::~Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<std::shared_ptr<chaiscript::AST_Node>_(const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&),_chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<chaiscript::AST_Node>,_const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&>_>
           *this)

{
  Proxy_Function_Base::~Proxy_Function_Base((Proxy_Function_Base *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~Proxy_Function_Callable_Impl() {}